

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FExecList::AddCommand(FExecList *this,char *cmd,char *file)

{
  int iVar1;
  int iVar2;
  char *file_00;
  FString local_90;
  int local_84;
  undefined1 local_80 [4];
  int i;
  FCommandLine argv;
  undefined1 local_48 [8];
  FCommandLine line;
  char *file_local;
  char *cmd_local;
  FExecList *this_local;
  
  line._32_8_ = file;
  if (((file == (char *)0x0) || (iVar1 = strncasecmp(cmd,"pullin",6), iVar1 != 0)) ||
     (iVar1 = isspace((int)cmd[6]), iVar1 == 0)) {
    iVar1 = strncasecmp(cmd,"exec",4);
    if ((iVar1 == 0) && (iVar1 = isspace((int)cmd[4]), iVar1 != 0)) {
      FCommandLine::FCommandLine((FCommandLine *)local_80,cmd,false);
      for (local_84 = 1; iVar1 = local_84, iVar2 = FCommandLine::argc((FCommandLine *)local_80),
          iVar1 < iVar2; local_84 = local_84 + 1) {
        file_00 = FCommandLine::operator[]((FCommandLine *)local_80,local_84);
        C_ParseExecFile(file_00,this);
      }
      FCommandLine::~FCommandLine((FCommandLine *)local_80);
    }
    else {
      FString::FString(&local_90,cmd);
      TArray<FString,_FString>::Push(&this->Commands,&local_90);
      FString::~FString(&local_90);
    }
  }
  else {
    FCommandLine::FCommandLine((FCommandLine *)local_48,cmd,false);
    C_SearchForPullins(this,(char *)line._32_8_,(FCommandLine *)local_48);
    FCommandLine::~FCommandLine((FCommandLine *)local_48);
  }
  return;
}

Assistant:

void FExecList::AddCommand(const char *cmd, const char *file)
{
	// Pullins are special and need to be separated from general commands.
	// They also turned out to be a really bad idea, since they make things
	// more complicated. :(
	if (file != NULL && strnicmp(cmd, "pullin", 6) == 0 && isspace(cmd[6]))
	{
		FCommandLine line(cmd);
		C_SearchForPullins(this, file, line);
	}
	// Recursive exec: Parse this file now.
	else if (strnicmp(cmd, "exec", 4) == 0 && isspace(cmd[4]))
	{
		FCommandLine argv(cmd);
		for (int i = 1; i < argv.argc(); ++i)
		{
			C_ParseExecFile(argv[i], this);
		}
	}
	else
	{
		Commands.Push(cmd);
	}
}